

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCore.c
# Opt level: O2

Aig_Man_t * Fra_FraigChoice(Aig_Man_t *pManAig,int nConfMax,int nLevelMax)

{
  Aig_Man_t *pAVar1;
  Fra_Par_t Pars;
  
  Fra_ParamsDefault(&Pars);
  Pars.fDoSparse = 1;
  Pars.fChoicing = 1;
  Pars.fSpeculate = 0;
  Pars.fProve = 0;
  Pars.fVerbose = 0;
  Pars.nBTLimitNode = nConfMax;
  Pars.nLevelMax = nLevelMax;
  Pars.fDontShowBar = Pars.fDoSparse;
  pAVar1 = Fra_FraigPerform(pManAig,&Pars);
  return pAVar1;
}

Assistant:

Aig_Man_t * Fra_FraigChoice( Aig_Man_t * pManAig, int nConfMax, int nLevelMax )
{
    Fra_Par_t Pars, * pPars = &Pars; 
    Fra_ParamsDefault( pPars );
    pPars->nBTLimitNode = nConfMax;
    pPars->fChoicing    = 1;
    pPars->fDoSparse    = 1;
    pPars->fSpeculate   = 0;
    pPars->fProve       = 0;
    pPars->fVerbose     = 0;
    pPars->fDontShowBar = 1;
    pPars->nLevelMax    = nLevelMax;
    return Fra_FraigPerform( pManAig, pPars );
}